

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
chains::Parameter<chains::phasor::Frequency>::name_abi_cxx11_
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Parameter<chains::phasor::Frequency> *this)

{
  char *pcVar1;
  allocator<char> local_6d [20];
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Parameter<chains::phasor::Frequency> *local_18;
  Parameter<chains::phasor::Frequency> *this_local;
  
  local_18 = this;
  this_local = (Parameter<chains::phasor::Frequency> *)__return_storage_ptr__;
  if (this->moduleName_ == (char *)0x0) {
    pcVar1 = phasor::Frequency::name();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,local_6d);
    std::allocator<char>::~allocator(local_6d);
  }
  else {
    pcVar1 = this->moduleName_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,&local_59);
    std::operator+(&local_38,&local_58,' ');
    pcVar1 = phasor::Frequency::name();
    std::operator+(__return_storage_ptr__,&local_38,pcVar1);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

auto name() const
  {
    if (moduleName_) {
      return std::string{moduleName_} + ' ' + Traits::name();
    } else {
      return std::string{Traits::name()};
    }
  }